

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

MOJOSHADER_astDataType *
add_type_coercion(Context_conflict *ctx,MOJOSHADER_astExpression **left,
                 MOJOSHADER_astDataType *_ldatatype,MOJOSHADER_astExpression **right,
                 MOJOSHADER_astDataType *_rdatatype)

{
  MOJOSHADER_astDataTypeType MVar1;
  MOJOSHADER_astDataType *pMVar2;
  MOJOSHADER_astDataType *pMVar3;
  int *piVar4;
  MOJOSHADER_astExpression *pMVar5;
  undefined4 *puVar6;
  MOJOSHADER_astExpression *pMVar7;
  MOJOSHADER_astDataTypeType MVar8;
  long lVar9;
  ulong uVar10;
  MOJOSHADER_astDataTypeType *pMVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  
  pMVar2 = reduce_datatype(ctx,_ldatatype);
  pMVar3 = reduce_datatype(ctx,_rdatatype);
  if (pMVar2 != pMVar3) {
    if (pMVar2 == (MOJOSHADER_astDataType *)0x0) {
      uVar10 = 6;
      bVar14 = true;
      bVar13 = true;
    }
    else {
      MVar1 = pMVar2->type;
      bVar14 = MVar1 != MOJOSHADER_AST_DATATYPE_VECTOR;
      bVar13 = 0xfffffffd < MVar1 - MOJOSHADER_AST_DATATYPE_BUFFER;
      MVar8 = MVar1;
      if (bVar13) {
        MVar8 = ((pMVar2->array).base)->type;
      }
      bVar13 = !bVar13 || MVar1 == MOJOSHADER_AST_DATATYPE_VECTOR;
      pMVar11 = &DAT_0015e050;
      uVar10 = 0;
      do {
        if (*pMVar11 == MVar8) goto LAB_00143b12;
        uVar10 = uVar10 + 1;
        pMVar11 = pMVar11 + 4;
      } while (uVar10 != 6);
      uVar10 = 6;
LAB_00143b12:
      uVar10 = uVar10 & 0xffffffff;
    }
    if (pMVar3 != (MOJOSHADER_astDataType *)0x0) {
      MVar1 = pMVar3->type;
      bVar15 = (MVar1 & ~MOJOSHADER_AST_DATATYPE_BOOL) == MOJOSHADER_AST_DATATYPE_VECTOR;
      MVar8 = MVar1;
      if (bVar15) {
        MVar8 = ((pMVar3->array).base)->type;
      }
      piVar4 = (int *)&DAT_0015e05c;
      uVar12 = 0;
      do {
        if (piVar4[-3] == MVar8) {
          if (5 < uVar12 || 5 < (uint)uVar10) break;
          if ((left == (MOJOSHADER_astExpression **)0x0) ||
             (!bVar13 && (!bVar15 || MVar1 == MOJOSHADER_AST_DATATYPE_VECTOR))) {
LAB_00143c06:
            pMVar7 = *right;
            pMVar5 = (MOJOSHADER_astExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
            if (pMVar5 == (MOJOSHADER_astExpression *)0x0) {
              ctx->isfail = 1;
              ctx->out_of_memory = 1;
            }
            else {
              (pMVar5->ast).type = MOJOSHADER_AST_OP_CAST;
              (pMVar5->ast).filename = ctx->sourcefile;
              (pMVar5->ast).line = ctx->sourceline;
              pMVar5->datatype = _ldatatype;
              *(MOJOSHADER_astExpression **)&pMVar5[1].ast = pMVar7;
            }
            *right = pMVar5;
            return _ldatatype;
          }
          if (!(bool)(bVar13 & (bVar15 && MVar1 != MOJOSHADER_AST_DATATYPE_VECTOR))) {
            if ((bool)(~bVar14 & MVar1 != MOJOSHADER_AST_DATATYPE_VECTOR)) goto LAB_00143c06;
            if (!(bool)(bVar14 & MVar1 == MOJOSHADER_AST_DATATYPE_VECTOR)) {
              lVar9 = uVar10 * 0x10;
              if (piVar4[-2] < *(int *)(&UNK_0015e054 + lVar9)) goto LAB_00143c06;
              if (piVar4[-2] <= *(int *)(&UNK_0015e054 + lVar9)) {
                if (*(int *)(&DAT_0015e05c + lVar9) == 0) {
                  if (*piVar4 != 0) goto LAB_00143b99;
                }
                else if (*piVar4 == 0) goto LAB_00143c06;
                if (*(int *)(&UNK_0015e058 + lVar9) != 0) {
                  if (piVar4[-1] == 0) goto LAB_00143c06;
                  break;
                }
                if (piVar4[-1] == 0) break;
              }
            }
          }
LAB_00143b99:
          pMVar7 = *left;
          pMVar5 = (MOJOSHADER_astExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
          if (pMVar5 == (MOJOSHADER_astExpression *)0x0) {
            ctx->isfail = 1;
            ctx->out_of_memory = 1;
          }
          else {
            (pMVar5->ast).type = MOJOSHADER_AST_OP_CAST;
            (pMVar5->ast).filename = ctx->sourcefile;
            (pMVar5->ast).line = ctx->sourceline;
            pMVar5->datatype = _rdatatype;
            *(MOJOSHADER_astExpression **)&pMVar5[1].ast = pMVar7;
          }
          *left = pMVar5;
          return _rdatatype;
        }
        uVar12 = uVar12 + 1;
        piVar4 = piVar4 + 4;
      } while (uVar12 != 6);
    }
    failf(ctx,"%s","incompatible data types");
    delete_expr(ctx,*right);
    puVar6 = (undefined4 *)(*ctx->malloc)(0x28,ctx->malloc_data);
    if (puVar6 == (undefined4 *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
    }
    else {
      *puVar6 = 0x31;
      *(char **)(puVar6 + 2) = ctx->sourcefile;
      puVar6[4] = ctx->sourceline;
      *(MOJOSHADER_astDataType **)(puVar6 + 6) = &ctx->dt_int;
      puVar6[8] = 0;
    }
    pMVar7 = (MOJOSHADER_astExpression *)(*ctx->malloc)(0x28,ctx->malloc_data);
    if (pMVar7 == (MOJOSHADER_astExpression *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
    }
    else {
      (pMVar7->ast).type = MOJOSHADER_AST_OP_CAST;
      (pMVar7->ast).filename = ctx->sourcefile;
      (pMVar7->ast).line = ctx->sourceline;
      pMVar7->datatype = _ldatatype;
      *(undefined4 **)&pMVar7[1].ast = puVar6;
    }
    *right = pMVar7;
  }
  return pMVar2;
}

Assistant:

static const MOJOSHADER_astDataType *add_type_coercion(Context *ctx,
                                     MOJOSHADER_astExpression **left,
                                     const MOJOSHADER_astDataType *_ldatatype,
                                     MOJOSHADER_astExpression **right,
                                     const MOJOSHADER_astDataType *_rdatatype)
{
    // !!! FIXME: this whole function is probably naive at best.
    const MOJOSHADER_astDataType *ldatatype = reduce_datatype(ctx, _ldatatype);
    const MOJOSHADER_astDataType *rdatatype = reduce_datatype(ctx, _rdatatype);

    if (ldatatype == rdatatype)
        return ldatatype;   // they already match, so we're done.

    struct {
        const MOJOSHADER_astDataTypeType type;
        const int bits;
        const int is_unsigned;
        const int floating;
    } typeinf[] = {
        { MOJOSHADER_AST_DATATYPE_BOOL,    1, 1, 0 },
        { MOJOSHADER_AST_DATATYPE_HALF,   16, 0, 1 },
        { MOJOSHADER_AST_DATATYPE_INT,    32, 0, 0 },
        { MOJOSHADER_AST_DATATYPE_UINT,   32, 1, 0 },
        { MOJOSHADER_AST_DATATYPE_FLOAT,  32, 0, 1 },
        { MOJOSHADER_AST_DATATYPE_DOUBLE, 64, 0, 1 },
    };

    int lvector = 0;
    int lmatrix = 0;
    int l = STATICARRAYLEN(typeinf);
    if (ldatatype != NULL)
    {
        MOJOSHADER_astDataTypeType type = ldatatype->type;
        if (type == MOJOSHADER_AST_DATATYPE_VECTOR)
        {
            lvector = 1;
            type = ldatatype->vector.base->type;
        } // if
        else if (type == MOJOSHADER_AST_DATATYPE_MATRIX)
        {
            lmatrix = 1;
            type = ldatatype->matrix.base->type;
        } // if

        for (l = 0; l < STATICARRAYLEN(typeinf); l++)
        {
            if (typeinf[l].type == type)
                break;
        } // for
    } // if

    int rvector = 0;
    int rmatrix = 0;
    int r = STATICARRAYLEN(typeinf);
    if (rdatatype != NULL)
    {
        MOJOSHADER_astDataTypeType type = rdatatype->type;
        if (type == MOJOSHADER_AST_DATATYPE_VECTOR)
        {
            rvector = 1;
            type = rdatatype->vector.base->type;
        } // if
        else if (type == MOJOSHADER_AST_DATATYPE_MATRIX)
        {
            rmatrix = 1;
            type = rdatatype->matrix.base->type;
        } // if

        for (r = 0; r < STATICARRAYLEN(typeinf); r++)
        {
            if (typeinf[r].type == type)
                break;
        } // for
    } // if

    enum { CHOOSE_NEITHER, CHOOSE_LEFT, CHOOSE_RIGHT } choice = CHOOSE_NEITHER;
    if ((l < STATICARRAYLEN(typeinf)) && (r < STATICARRAYLEN(typeinf)))
    {
        if (left == NULL)
            choice = CHOOSE_LEFT;  // we need to force to the lvalue.
        else if (lmatrix && !rmatrix)
            choice = CHOOSE_LEFT;
        else if (!lmatrix && rmatrix)
            choice = CHOOSE_RIGHT;
        else if (lvector && !rvector)
            choice = CHOOSE_LEFT;
        else if (!lvector && rvector)
            choice = CHOOSE_RIGHT;
        else if (typeinf[l].bits > typeinf[r].bits)
            choice = CHOOSE_LEFT;
        else if (typeinf[l].bits < typeinf[r].bits)
            choice = CHOOSE_RIGHT;
        else if (typeinf[l].floating && !typeinf[r].floating)
            choice = CHOOSE_LEFT;
        else if (!typeinf[l].floating && typeinf[r].floating)
            choice = CHOOSE_RIGHT;
        else if (typeinf[l].is_unsigned && !typeinf[r].is_unsigned)
            choice = CHOOSE_LEFT;
        else if (!typeinf[l].is_unsigned && typeinf[r].is_unsigned)
            choice = CHOOSE_RIGHT;
    } // if

    if (choice == CHOOSE_LEFT)
    {
        *right = new_cast_expr(ctx, _ldatatype, *right);
        return _ldatatype;
    } // if
    else if (choice == CHOOSE_RIGHT)
    {
        *left = new_cast_expr(ctx, _rdatatype, *left);
        return _rdatatype;
    } // else if

    assert(choice == CHOOSE_NEITHER);
    fail(ctx, "incompatible data types");
    // Ditch original (*right), force a literal value that matches
    //  ldatatype, so further processing is normalized.
    // !!! FIXME: force (right) to match (left).
    delete_expr(ctx, *right);
    *right = new_cast_expr(ctx, _ldatatype, new_literal_int_expr(ctx, 0));
    return ldatatype;
}